

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O1

void __thiscall
tcu::ThreadUtil::Object::modify
          (Object *this,SharedPtr<tcu::ThreadUtil::Event> *event,
          vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
          *deps)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  pointer pSVar3;
  long lVar4;
  long lVar5;
  
  pSVar3 = (this->m_reads).
           super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_reads).
                              super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) >> 4)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      std::
      vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
      ::push_back(deps,(value_type *)((long)&pSVar3->m_ptr + lVar4));
      lVar5 = lVar5 + 1;
      pSVar3 = (this->m_reads).
               super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x10;
    } while (lVar5 < (int)((ulong)((long)(this->m_reads).
                                         super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3)
                          >> 4));
  }
  std::
  vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ::push_back(deps,&this->m_modify);
  pSVar2 = (this->m_modify).m_state;
  if (pSVar2 != event->m_state) {
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar2->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_modify).m_ptr = (Event *)0x0;
        (*((this->m_modify).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_modify).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar2 = (this->m_modify).m_state;
        if (pSVar2 != (SharedPtrStateBase *)0x0) {
          (*pSVar2->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_modify).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_modify).m_ptr = event->m_ptr;
    pSVar2 = event->m_state;
    (this->m_modify).m_state = pSVar2;
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_modify).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  std::
  vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ::_M_erase_at_end(&this->m_reads,
                    (this->m_reads).
                    super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void Object::modify (SharedPtr<Event> event, std::vector<SharedPtr<Event> >& deps)
{
	// Make call depend on all reads
	for (int readNdx = 0; readNdx < (int)m_reads.size(); readNdx++)
	{
		deps.push_back(m_reads[readNdx]);
	}
	deps.push_back(m_modify);

	// Update last modifying call
	m_modify = event;

	// Clear read dependencies of last "version" of this object
	m_reads.clear();
}